

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O0

char * luaX_token2str(LexState *ls,int token)

{
  char *s;
  int token_local;
  LexState *ls_local;
  
  if (token < 0x101) {
    ls_local = (LexState *)luaO_pushfstring(ls->L,"\'%c\'",(ulong)(uint)token);
  }
  else {
    ls_local = (LexState *)luaX_tokens[token + -0x101];
    if (token < 0x121) {
      ls_local = (LexState *)luaO_pushfstring(ls->L,"\'%s\'",ls_local);
    }
  }
  return (char *)ls_local;
}

Assistant:

const char *luaX_token2str(LexState *ls, int token) {
    if (token < FIRST_RESERVED) {  /* single-byte symbols? */
        lua_assert(token == cast_uchar(token));
        return luaO_pushfstring(ls->L, "'%c'", token);
    } else {
        const char *s = luaX_tokens[token - FIRST_RESERVED];
        if (token < TK_EOS)  /* fixed format (symbols and reserved words)? */
            return luaO_pushfstring(ls->L, "'%s'", s);
        else  /* names, strings, and numerals */
            return s;
    }
}